

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O1

void __thiscall
SourceMapTest_SourceMapSourceRootFile_Test::TestBody
          (SourceMapTest_SourceMapSourceRootFile_Test *this)

{
  char *pcVar1;
  undefined1 local_60 [8];
  string sourceMap;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  
  local_60 = (undefined1  [8])&sourceMap._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_60,
             "\n    {\n      \"version\":3,\n      \"file\": \"foo.wasm\",\n      \"sources\":[],\n      \"names\":[],\n      \"mappings\": \"\",\n      \"sourceRoot\": \"/foo/bar\"\n    }\n  "
             ,"");
  SourceMapTest::parseMap(&this->super_SourceMapTest,(string *)local_60);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)(sourceMap.field_2._M_local_buf + 8),"wasm.debugInfoSourceRoot",
             "\"/foo/bar\"",&(this->super_SourceMapTest).wasm.debugInfoSourceRoot,
             (char (*) [9])"/foo/bar");
  if (sourceMap.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
               ,0xd5,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)(sourceMap.field_2._M_local_buf + 8),"wasm.debugInfoFile","\"foo.wasm\"",
             &(this->super_SourceMapTest).wasm.debugInfoFile,(char (*) [9])"foo.wasm");
  if (sourceMap.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)&local_28);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
               ,0xd6,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  if (local_60 != (undefined1  [8])&sourceMap._M_string_length) {
    operator_delete((void *)local_60,sourceMap._M_string_length + 1);
  }
  return;
}

Assistant:

TEST_F(SourceMapTest, SourceMapSourceRootFile) {
  std::string sourceMap = R"(
    {
      "version":3,
      "file": "foo.wasm",
      "sources":[],
      "names":[],
      "mappings": "",
      "sourceRoot": "/foo/bar"
    }
  )";
  parseMap(sourceMap);
  EXPECT_EQ(wasm.debugInfoSourceRoot, "/foo/bar");
  EXPECT_EQ(wasm.debugInfoFile, "foo.wasm");
}